

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBlock_btlazy2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  seqDef *psVar2;
  int iVar3;
  bool bVar4;
  undefined8 uVar5;
  uint uVar6;
  BYTE *pStart;
  BYTE *pBVar7;
  ulong *puVar8;
  U32 UVar9;
  ulong *puVar10;
  ulong *puVar11;
  long lVar12;
  ulong *puVar13;
  U32 UVar14;
  size_t sVar15;
  BYTE *litEnd;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  U32 UVar22;
  uint uVar23;
  ulong uVar24;
  BYTE *pBVar25;
  ulong *puVar26;
  ulong *puVar27;
  size_t offsetFound;
  BYTE *pInLoopLimit;
  BYTE *litLimit_w;
  BYTE *local_b0;
  size_t local_a0;
  ulong *local_98;
  ulong *local_90;
  ulong *local_88;
  uint local_7c;
  ulong *local_78;
  ulong *local_70;
  ZSTD_matchState_t *local_68;
  uint local_5c;
  uint local_58;
  uint local_54;
  long local_50;
  ulong *local_48;
  U32 *local_40;
  BYTE *local_38;
  
  puVar8 = (ulong *)((long)src + srcSize);
  local_38 = (ms->window).base + (ms->window).dictLimit;
  local_54 = rep[1];
  puVar27 = (ulong *)((ulong)((int)src == (int)local_38) + (long)src);
  local_58 = (int)puVar27 - (int)local_38;
  uVar20 = (ulong)local_54;
  if (local_58 < local_54) {
    uVar20 = 0;
  }
  UVar14 = (U32)uVar20;
  local_88 = (ulong *)((long)src + (srcSize - 8));
  local_5c = *rep;
  uVar24 = (ulong)local_5c;
  if (local_58 < local_5c) {
    uVar24 = 0;
  }
  UVar22 = (U32)uVar24;
  local_40 = rep;
  if (puVar27 < local_88) {
    local_98 = (ulong *)((long)puVar8 + -7);
    local_70 = (ulong *)((long)puVar8 + -3);
    local_78 = (ulong *)((long)puVar8 + -1);
    local_48 = puVar8 + -4;
    local_90 = puVar8;
    local_68 = ms;
    do {
      uVar23 = (uint)uVar24;
      local_50 = -uVar24;
      local_7c = (uint)uVar20;
      if (uVar23 == 0) {
        pBVar25 = (BYTE *)0x0;
      }
      else {
        pBVar25 = (BYTE *)0x0;
        if (*(int *)(((long)puVar27 + 1) - uVar24) == *(int *)((long)puVar27 + 1)) {
          puVar26 = (ulong *)((long)puVar27 + 5);
          puVar10 = (ulong *)((long)puVar27 + local_50 + 5);
          puVar13 = puVar26;
          if (puVar26 < local_98) {
            uVar17 = *puVar26 ^ *puVar10;
            uVar20 = 0;
            if (uVar17 != 0) {
              for (; (uVar17 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
              }
            }
            pBVar25 = (BYTE *)(uVar20 >> 3 & 0x1fffffff);
            if (*puVar10 == *puVar26) {
              puVar13 = (ulong *)((long)puVar27 + 0xd);
              puVar10 = (ulong *)((long)puVar27 + local_50 + 0xd);
              do {
                if (local_98 <= puVar13) goto LAB_00119f21;
                uVar20 = *puVar10;
                uVar17 = *puVar13;
                uVar18 = uVar17 ^ uVar20;
                uVar21 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                  }
                }
                pBVar25 = (BYTE *)((long)puVar13 + ((uVar21 >> 3 & 0x1fffffff) - (long)puVar26));
                puVar13 = puVar13 + 1;
                puVar10 = puVar10 + 1;
              } while (uVar20 == uVar17);
            }
          }
          else {
LAB_00119f21:
            if ((puVar13 < local_70) && ((int)*puVar10 == (int)*puVar13)) {
              puVar13 = (ulong *)((long)puVar13 + 4);
              puVar10 = (ulong *)((long)puVar10 + 4);
            }
            if ((puVar13 < local_78) && ((short)*puVar10 == (short)*puVar13)) {
              puVar13 = (ulong *)((long)puVar13 + 2);
              puVar10 = (ulong *)((long)puVar10 + 2);
            }
            if (puVar13 < puVar8) {
              puVar13 = (ulong *)((long)puVar13 + (ulong)((BYTE)*puVar10 == (BYTE)*puVar13));
            }
            pBVar25 = (BYTE *)((long)puVar13 - (long)puVar26);
          }
          pBVar25 = pBVar25 + 4;
        }
      }
      local_a0 = 999999999;
      pBVar7 = (BYTE *)ZSTD_BtFindBestMatch_selectMLS
                                 (local_68,(BYTE *)puVar27,(BYTE *)puVar8,&local_a0);
      local_b0 = pBVar25;
      if (pBVar25 < pBVar7) {
        local_b0 = pBVar7;
      }
      if (local_b0 < (BYTE *)0x4) {
        uVar20 = (ulong)local_7c;
        puVar8 = local_90;
        puVar27 = (ulong *)((long)puVar27 + ((long)puVar27 - (long)src >> 8) + 1);
      }
      else {
        puVar8 = puVar27;
        sVar15 = local_a0;
        if (pBVar7 <= pBVar25) {
          puVar8 = (ulong *)((long)puVar27 + 1);
          sVar15 = 0;
        }
        if (puVar27 < local_88) {
          do {
            puVar26 = (ulong *)((long)puVar27 + 1);
            if (((sVar15 != 0) && (uVar23 != 0)) &&
               (*(int *)puVar26 == *(int *)((long)puVar26 + local_50))) {
              puVar13 = (ulong *)((long)puVar27 + 5);
              puVar11 = (ulong *)((long)puVar27 + local_50 + 5);
              puVar10 = puVar13;
              if (puVar13 < local_98) {
                uVar24 = *puVar13 ^ *puVar11;
                uVar20 = 0;
                if (uVar24 != 0) {
                  for (; (uVar24 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                  }
                }
                pBVar25 = (BYTE *)(uVar20 >> 3 & 0x1fffffff);
                if (*puVar11 == *puVar13) {
                  puVar10 = (ulong *)((long)puVar27 + 0xd);
                  puVar11 = (ulong *)((long)puVar27 + local_50 + 0xd);
                  do {
                    if (local_98 <= puVar10) goto LAB_0011a08a;
                    uVar20 = *puVar11;
                    uVar24 = *puVar10;
                    uVar21 = uVar24 ^ uVar20;
                    uVar17 = 0;
                    if (uVar21 != 0) {
                      for (; (uVar21 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                      }
                    }
                    pBVar25 = (BYTE *)((long)puVar10 + ((uVar17 >> 3 & 0x1fffffff) - (long)puVar13))
                    ;
                    puVar10 = puVar10 + 1;
                    puVar11 = puVar11 + 1;
                  } while (uVar20 == uVar24);
                }
              }
              else {
LAB_0011a08a:
                if ((puVar10 < local_70) && ((int)*puVar11 == (int)*puVar10)) {
                  puVar10 = (ulong *)((long)puVar10 + 4);
                  puVar11 = (ulong *)((long)puVar11 + 4);
                }
                if ((puVar10 < local_78) && ((short)*puVar11 == (short)*puVar10)) {
                  puVar10 = (ulong *)((long)puVar10 + 2);
                  puVar11 = (ulong *)((long)puVar11 + 2);
                }
                if (puVar10 < local_90) {
                  puVar10 = (ulong *)((long)puVar10 + (ulong)((BYTE)*puVar11 == (BYTE)*puVar10));
                }
                pBVar25 = (BYTE *)((long)puVar10 - (long)puVar13);
              }
              uVar6 = (int)sVar15 + 1;
              if (uVar6 == 0) goto LAB_0011a74a;
              if (pBVar25 < (BYTE *)0xfffffffffffffffc) {
                uVar16 = 0x1f;
                if (uVar6 != 0) {
                  for (; uVar6 >> uVar16 == 0; uVar16 = uVar16 - 1) {
                  }
                }
                if ((int)((uVar16 ^ 0x1f) + (int)local_b0 * 3 + -0x1e) < (int)(pBVar25 + 4) * 3) {
                  sVar15 = 0;
                  puVar8 = puVar26;
                  local_b0 = pBVar25 + 4;
                }
              }
            }
            local_a0 = 999999999;
            pBVar25 = (BYTE *)ZSTD_BtFindBestMatch_selectMLS
                                        (local_68,(BYTE *)puVar26,(BYTE *)local_90,&local_a0);
            uVar6 = (int)local_a0 + 1;
            if ((uVar6 == 0) || (uVar16 = (int)sVar15 + 1, uVar16 == 0)) {
LAB_0011a74a:
              __assert_fail("val != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x12c2,"U32 ZSTD_highbit32(U32)");
            }
            bVar4 = true;
            if ((BYTE *)0x3 < pBVar25) {
              iVar3 = 0x1f;
              if (uVar6 != 0) {
                for (; uVar6 >> iVar3 == 0; iVar3 = iVar3 + -1) {
                }
              }
              uVar6 = 0x1f;
              if (uVar16 != 0) {
                for (; uVar16 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                }
              }
              if ((int)((uVar6 ^ 0x1f) + (int)local_b0 * 4 + -0x1b) < (int)pBVar25 * 4 - iVar3) {
                bVar4 = false;
                sVar15 = local_a0;
                puVar8 = puVar26;
                local_b0 = pBVar25;
              }
            }
            if (bVar4) {
              if (local_88 <= puVar26) break;
              puVar26 = (ulong *)((long)puVar27 + 2);
              if (((sVar15 != 0) && (uVar23 != 0)) &&
                 (*(int *)puVar26 == *(int *)((long)puVar26 + local_50))) {
                puVar13 = (ulong *)((long)puVar27 + 6);
                puVar11 = (ulong *)((long)puVar27 + local_50 + 6);
                puVar10 = puVar13;
                if (puVar13 < local_98) {
                  uVar24 = *puVar13 ^ *puVar11;
                  uVar20 = 0;
                  if (uVar24 != 0) {
                    for (; (uVar24 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                    }
                  }
                  pBVar25 = (BYTE *)(uVar20 >> 3 & 0x1fffffff);
                  if (*puVar11 == *puVar13) {
                    puVar10 = (ulong *)((long)puVar27 + 0xe);
                    puVar11 = (ulong *)((long)puVar27 + local_50 + 0xe);
                    do {
                      if (local_98 <= puVar10) goto LAB_0011a22f;
                      uVar20 = *puVar11;
                      uVar24 = *puVar10;
                      uVar21 = uVar24 ^ uVar20;
                      uVar17 = 0;
                      if (uVar21 != 0) {
                        for (; (uVar21 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                        }
                      }
                      pBVar25 = (BYTE *)((long)puVar10 +
                                        ((uVar17 >> 3 & 0x1fffffff) - (long)puVar13));
                      puVar10 = puVar10 + 1;
                      puVar11 = puVar11 + 1;
                    } while (uVar20 == uVar24);
                  }
                }
                else {
LAB_0011a22f:
                  if ((puVar10 < local_70) && ((int)*puVar11 == (int)*puVar10)) {
                    puVar10 = (ulong *)((long)puVar10 + 4);
                    puVar11 = (ulong *)((long)puVar11 + 4);
                  }
                  if ((puVar10 < local_78) && ((short)*puVar11 == (short)*puVar10)) {
                    puVar10 = (ulong *)((long)puVar10 + 2);
                    puVar11 = (ulong *)((long)puVar11 + 2);
                  }
                  if (puVar10 < local_90) {
                    puVar10 = (ulong *)((long)puVar10 + (ulong)((BYTE)*puVar11 == (BYTE)*puVar10));
                  }
                  pBVar25 = (BYTE *)((long)puVar10 - (long)puVar13);
                }
                uVar6 = (int)sVar15 + 1;
                if (uVar6 == 0) goto LAB_0011a74a;
                if (pBVar25 < (BYTE *)0xfffffffffffffffc) {
                  uVar16 = 0x1f;
                  if (uVar6 != 0) {
                    for (; uVar6 >> uVar16 == 0; uVar16 = uVar16 - 1) {
                    }
                  }
                  if ((int)((uVar16 ^ 0x1f) + (int)local_b0 * 4 + -0x1e) < (int)(pBVar25 + 4) * 4) {
                    sVar15 = 0;
                    puVar8 = puVar26;
                    local_b0 = pBVar25 + 4;
                  }
                }
              }
              local_a0 = 999999999;
              pBVar25 = (BYTE *)ZSTD_BtFindBestMatch_selectMLS
                                          (local_68,(BYTE *)puVar26,(BYTE *)local_90,&local_a0);
              uVar6 = (int)local_a0 + 1;
              if ((uVar6 == 0) || (uVar16 = (int)sVar15 + 1, uVar16 == 0)) goto LAB_0011a74a;
              bVar4 = true;
              if ((BYTE *)0x3 < pBVar25) {
                iVar3 = 0x1f;
                if (uVar6 != 0) {
                  for (; uVar6 >> iVar3 == 0; iVar3 = iVar3 + -1) {
                  }
                }
                uVar6 = 0x1f;
                if (uVar16 != 0) {
                  for (; uVar16 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                  }
                }
                if ((int)((uVar6 ^ 0x1f) + (int)local_b0 * 4 + -0x18) < (int)pBVar25 * 4 - iVar3) {
                  bVar4 = false;
                  sVar15 = local_a0;
                  puVar8 = puVar26;
                  local_b0 = pBVar25;
                }
              }
              if (bVar4) break;
            }
            puVar27 = puVar26;
          } while (puVar26 < local_88);
        }
        if (sVar15 == 0) {
          UVar14 = 1;
          uVar6 = uVar23;
          uVar23 = local_7c;
        }
        else {
          if ((src < puVar8) && (local_38 < (BYTE *)((long)puVar8 + (2 - sVar15)))) {
            puVar27 = puVar8;
            while (puVar8 = puVar27,
                  *(BYTE *)((long)puVar27 + -1) == *(BYTE *)((long)puVar27 + (1 - sVar15))) {
              puVar8 = (ulong *)((long)puVar27 + -1);
              local_b0 = local_b0 + 1;
              if ((puVar8 <= src) ||
                 (pBVar25 = (BYTE *)((long)puVar27 + (1 - sVar15)), puVar27 = puVar8,
                 pBVar25 <= local_38)) break;
            }
          }
          UVar14 = (int)sVar15 + 1;
          uVar6 = (int)sVar15 - 2;
        }
        uVar20 = (ulong)uVar23;
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_0011a7a7:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2038,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
LAB_0011a7c6:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203a,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar24 = (long)puVar8 - (long)src;
        puVar27 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar27 + uVar24)) {
LAB_0011a769:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_90 < puVar8) {
LAB_0011a788:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203c,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_48 < puVar8) {
          ZSTD_safecopyLiterals((BYTE *)puVar27,(BYTE *)src,(BYTE *)puVar8,(BYTE *)local_48);
        }
        else {
          uVar17 = *(ulong *)((long)src + 8);
          *puVar27 = *src;
          puVar27[1] = uVar17;
          if (0x10 < uVar24) {
            pBVar25 = seqStore->lit;
            puVar27 = (ulong *)(pBVar25 + 0x10);
            puVar26 = (ulong *)((long)src + 0x10);
            if (0xffffffffffffffe8 < (ulong)((long)puVar27 + (-8 - (long)puVar26))) {
              __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1268,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            if (0xffffffffffffffe0 < (ulong)((long)puVar27 + (-0x10 - (long)puVar26))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1270,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar17 = *(ulong *)((long)src + 0x18);
            *puVar27 = *puVar26;
            *(ulong *)(pBVar25 + 0x18) = uVar17;
            if (0x20 < (long)uVar24) {
              lVar12 = 0;
              do {
                puVar1 = (undefined8 *)((long)src + lVar12 + 0x20);
                uVar5 = puVar1[1];
                pBVar7 = pBVar25 + lVar12 + 0x20;
                *(undefined8 *)pBVar7 = *puVar1;
                *(undefined8 *)(pBVar7 + 8) = uVar5;
                puVar1 = (undefined8 *)((long)src + lVar12 + 0x30);
                uVar5 = puVar1[1];
                *(undefined8 *)(pBVar7 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar7 + 0x18) = uVar5;
                lVar12 = lVar12 + 0x20;
              } while (pBVar7 + 0x20 < pBVar25 + uVar24);
            }
          }
        }
        puVar26 = local_98;
        seqStore->lit = seqStore->lit + uVar24;
        if (0xffff < uVar24) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x204d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar2 = seqStore->sequences;
        psVar2->litLength = (U16)uVar24;
        psVar2->offset = UVar14;
        uVar24 = (ulong)uVar6;
        if ((BYTE *)0xffff < local_b0 + -3) {
          if (seqStore->longLengthID != 0) {
LAB_0011a7e5:
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2058,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar2 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar2->matchLength = (U16)(local_b0 + -3);
        seqStore->sequences = psVar2 + 1;
        src = (void *)((long)puVar8 + (long)local_b0);
        puVar8 = local_90;
        puVar27 = (ulong *)src;
        if ((uVar23 != 0) && (src <= local_88)) {
          while (uVar21 = uVar20, uVar17 = uVar24, uVar20 = uVar21, uVar24 = uVar17,
                puVar27 = (ulong *)src, (int)*src == *(int *)((long)src - uVar21)) {
            puVar27 = (ulong *)((long)src + 4);
            puVar10 = (ulong *)((long)src + (4 - uVar21));
            puVar13 = puVar27;
            if (puVar27 < puVar26) {
              uVar24 = *puVar27 ^ *puVar10;
              uVar20 = 0;
              if (uVar24 != 0) {
                for (; (uVar24 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                }
              }
              pBVar25 = (BYTE *)(uVar20 >> 3 & 0x1fffffff);
              if (*puVar10 == *puVar27) {
                puVar13 = (ulong *)((long)src + 0xc);
                puVar10 = (ulong *)((long)src + (0xc - uVar21));
                do {
                  if (puVar26 <= puVar13) goto LAB_0011a5ca;
                  uVar20 = *puVar10;
                  uVar24 = *puVar13;
                  uVar19 = uVar24 ^ uVar20;
                  uVar18 = 0;
                  if (uVar19 != 0) {
                    for (; (uVar19 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                    }
                  }
                  pBVar25 = (BYTE *)((long)puVar13 + ((uVar18 >> 3 & 0x1fffffff) - (long)puVar27));
                  puVar13 = puVar13 + 1;
                  puVar10 = puVar10 + 1;
                } while (uVar20 == uVar24);
              }
            }
            else {
LAB_0011a5ca:
              if ((puVar13 < local_70) && ((int)*puVar10 == (int)*puVar13)) {
                puVar13 = (ulong *)((long)puVar13 + 4);
                puVar10 = (ulong *)((long)puVar10 + 4);
              }
              if ((puVar13 < local_78) && ((short)*puVar10 == (short)*puVar13)) {
                puVar13 = (ulong *)((long)puVar13 + 2);
                puVar10 = (ulong *)((long)puVar10 + 2);
              }
              if (puVar13 < puVar8) {
                puVar13 = (ulong *)((long)puVar13 + (ulong)((BYTE)*puVar10 == (BYTE)*puVar13));
              }
              pBVar25 = (BYTE *)((long)puVar13 - (long)puVar27);
            }
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
            goto LAB_0011a7a7;
            if (0x20000 < seqStore->maxNbLit) goto LAB_0011a7c6;
            puVar27 = (ulong *)seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < puVar27) goto LAB_0011a769;
            if (puVar8 < src) goto LAB_0011a788;
            if (local_48 < src) {
              ZSTD_safecopyLiterals((BYTE *)puVar27,(BYTE *)src,(BYTE *)src,(BYTE *)local_48);
              puVar8 = local_90;
            }
            else {
              uVar20 = *(ulong *)((long)src + 8);
              *puVar27 = *src;
              puVar27[1] = uVar20;
            }
            psVar2 = seqStore->sequences;
            psVar2->litLength = 0;
            psVar2->offset = 1;
            if ((BYTE *)0xffff < pBVar25 + 1) {
              if (seqStore->longLengthID != 0) goto LAB_0011a7e5;
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar2 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar2->matchLength = (U16)(pBVar25 + 1);
            seqStore->sequences = psVar2 + 1;
            src = (void *)((long)src + (long)(pBVar25 + 4));
            uVar20 = uVar17;
            uVar24 = uVar21;
            puVar27 = (ulong *)src;
            if (((int)uVar17 == 0) || (local_88 < src)) break;
          }
        }
      }
      UVar14 = (U32)uVar20;
      UVar22 = (U32)uVar24;
    } while (puVar27 < local_88);
  }
  UVar9 = 0;
  if (local_58 < local_54) {
    UVar9 = local_54;
  }
  if (local_58 < local_5c) {
    UVar9 = local_5c;
  }
  if (UVar22 == 0) {
    UVar22 = UVar9;
  }
  if (UVar14 != 0) {
    UVar9 = UVar14;
  }
  *local_40 = UVar22;
  local_40[1] = UVar9;
  return (long)puVar8 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_btlazy2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_binaryTree, 2, ZSTD_noDict);
}